

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

void __thiscall Fl_Tree::show_item_middle(Fl_Tree *this,Fl_Tree_Item *item)

{
  if (item == (Fl_Tree_Item *)0x0) {
    item = this->_root;
  }
  if (item != (Fl_Tree_Item *)0x0) {
    show_item(this,item,(this->super_Fl_Group).super_Fl_Widget.h_ / 2 - item->_xywh[3] / 2);
    return;
  }
  return;
}

Assistant:

void Fl_Tree::show_item_middle(Fl_Tree_Item *item) {
  item = item ? item : first();
#if FLTK_ABI_VERSION >= 10303
  if (item) show_item(item, (_tih/2)-(item->h()/2));
#else
  if (item) show_item(item, (h()/2)-(item->h()/2));
#endif
}